

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O1

bool verona::subtype(Btypes *predicates,Btype *sub,Btype *sup,Bounds *bounds)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Sequent seq;
  Sequent local_108;
  
  p_Var1 = &local_108.bounds._M_t._M_impl.super__Rb_tree_header;
  local_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&local_108,0,0xa8);
  local_108.bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ::std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>>
            ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
              *)&local_108,
             local_108.lhs_pending.
             super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (predicates->
             super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (predicates->
             super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&local_108.lhs_pending,(value_type *)sub);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&local_108.rhs_pending,(value_type *)sup);
  bVar2 = Sequent::reduce(&local_108);
  if (bVar2) {
    merge(bounds,&local_108.bounds);
  }
  std::
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_verona::Bound>,_std::_Select1st<std::pair<const_trieste::Location,_verona::Bound>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
  ::~_Rb_tree(&local_108.bounds._M_t);
  std::vector<verona::Assume,_std::allocator<verona::Assume>_>::~vector(&local_108.assumptions);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.predicates);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.self);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.rhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.lhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.rhs_pending);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_108.lhs_pending);
  return bVar2;
}

Assistant:

bool subtype(Btypes& predicates, Btype sub, Btype sup, Bounds& bounds)
  {
    Sequent seq;
    seq.lhs_pending.insert(
      seq.lhs_pending.end(), predicates.begin(), predicates.end());
    seq.lhs_pending.push_back(sub);
    seq.rhs_pending.push_back(sup);

    if (!seq.reduce())
      return false;

    merge(bounds, seq.bounds);
    return true;
  }